

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O3

void __thiscall Maze::pathBetweenCells(Maze *this)

{
  iterator *piVar1;
  _Tuple_impl<0UL,_int,_int> _Var2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  _Tuple_impl<0UL,_int,_int> *p_Var6;
  tuple<int,_int> *ptVar7;
  _Tuple_impl<0UL,_int,_int> *p_Var8;
  _Tuple_impl<0UL,_int,_int> in_RAX;
  _Elt_pointer ptVar9;
  ulong uVar10;
  _Elt_pointer ptVar11;
  _Tuple_impl<0UL,_int,_int> *p_Var12;
  ulong uVar13;
  _Elt_pointer ptVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  reference rVar20;
  tuple<int,_int> successorIndex;
  undefined1 local_38 [8];
  
  local_38 = (undefined1  [8])in_RAX;
  startCellEndCells(this);
  uVar15 = (ulong)(this->startCell).super__Tuple_impl<0UL,_int,_int>.
                  super__Head_base<0UL,_int,_false>._M_head_impl;
  pvVar3 = (this->used).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((long)(this->used).
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
           -0x3333333333333333;
  uVar10 = uVar15;
  if (uVar15 <= uVar13 && uVar13 - uVar15 != 0) {
    uVar16 = (ulong)(this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                    super__Head_base<1UL,_int,_false>._M_head_impl;
    rVar20 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3 + uVar15,uVar16);
    *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
    pvVar4 = (this->solvedMatrix).
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = ((long)(this->solvedMatrix).
                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
             -0x5555555555555555;
    if ((uVar15 <= uVar13 && uVar13 - uVar15 != 0) &&
       (lVar5 = *(long *)&pvVar4[uVar15].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data, uVar10 = uVar16,
       uVar16 < (ulong)((long)*(pointer *)
                               ((long)&pvVar4[uVar15].
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data + 8) - lVar5))) {
      *(undefined1 *)(lVar5 + uVar16) = 0x20;
      p_Var6 = &((this->pathStack).c.
                 super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur)->super__Tuple_impl<0UL,_int,_int>;
      if (p_Var6 == &(this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                     super__Tuple_impl<0UL,_int,_int>) {
        std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>::
        _M_push_back_aux<std::tuple<int,int>const&>
                  ((deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>> *)this,
                   &this->startCell);
        ptVar9 = (this->pathStack).c.
                 super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      else {
        *p_Var6 = (this->startCell).super__Tuple_impl<0UL,_int,_int>;
        ptVar9 = (this->pathStack).c.
                 super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        (this->pathStack).c.
        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = ptVar9;
      }
      if (ptVar9 != (this->pathStack).c.
                    super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur) {
        ptVar11 = (this->pathStack).c.
                  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          if (ptVar9 == ptVar11) {
            ptVar9 = (this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
          }
          else {
            ptVar9 = ptVar9 + -1;
          }
          adjacentCells((Maze *)local_38,(int)this,
                        (ptVar9->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>
                        ._M_head_impl);
          p_Var6 = &((this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                    super__Tuple_impl<0UL,_int,_int>;
          if (p_Var6 == &((this->pathStack).c.
                          super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first)->
                         super__Tuple_impl<0UL,_int,_int>) {
            ptVar7 = (this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            p_Var8 = &ptVar7[0x3f].super__Tuple_impl<0UL,_int,_int>;
            p_Var12 = &ptVar7[0x40].super__Tuple_impl<0UL,_int,_int>;
          }
          else {
            p_Var8 = p_Var6 + -1;
            p_Var12 = p_Var6;
          }
          uVar13 = (ulong)(int)local_38._4_4_;
          if (local_38._4_4_ == -1) {
            uVar15 = (ulong)(p_Var8->super__Head_base<0UL,_int,_false>)._M_head_impl;
            pvVar4 = (this->solvedMatrix).
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = ((long)(this->solvedMatrix).
                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                     -0x5555555555555555;
            uVar10 = uVar15;
            if (uVar13 < uVar15 || uVar13 - uVar15 == 0) goto LAB_00102de9;
            uVar10 = (ulong)((_Elt_pointer)p_Var12)[-1].super__Tuple_impl<0UL,_int,_int>.
                            super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                            _M_head_impl;
            lVar5 = *(long *)&pvVar4[uVar15].super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .super__Vector_impl_data;
            if ((ulong)((long)*(pointer *)
                               ((long)&pvVar4[uVar15].
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data + 8) - lVar5) <= uVar10)
            goto LAB_00102de9;
            *(undefined1 *)(lVar5 + uVar10) = 0x30;
            std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::pop_back
                      ((deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)this);
          }
          else {
            uVar15 = (ulong)(int)local_38._0_4_;
            if (p_Var6 == &(this->pathStack).c.
                           super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                           super__Tuple_impl<0UL,_int,_int>) {
              std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>::
              _M_push_back_aux<std::tuple<int,int>const&>
                        ((deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>> *)this,
                         (tuple<int,_int> *)local_38);
            }
            else {
              p_Var6->super__Tuple_impl<1UL,_int> = (_Tuple_impl<1UL,_int>)local_38._0_4_;
              p_Var6->super__Head_base<0UL,_int,_false> =
                   (_Head_base<0UL,_int,_false>)local_38._4_4_;
              piVar1 = &(this->pathStack).c.
                        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            pvVar4 = (this->solvedMatrix).
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = ((long)(this->solvedMatrix).
                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                     -0x5555555555555555;
            uVar10 = uVar13;
            if ((uVar16 < uVar13 || uVar16 - uVar13 == 0) ||
               (lVar5 = *(long *)&pvVar4[uVar13].super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data, uVar10 = uVar15,
               (ulong)((long)*(pointer *)
                              ((long)&pvVar4[uVar13].super__Vector_base<char,_std::allocator<char>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar5) <= uVar15))
            goto LAB_00102de9;
            *(undefined1 *)(lVar5 + uVar15) = 0x20;
            pvVar3 = (this->used).
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = ((long)(this->used).
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                     -0x3333333333333333;
            uVar10 = uVar13;
            if (uVar16 < uVar13 || uVar16 - uVar13 == 0) goto LAB_00102de9;
            rVar20 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3 + uVar13,uVar15);
            *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
          }
          ptVar9 = (this->pathStack).c.
                   super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ptVar9 == (this->pathStack).c.
                        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error: their is no path",0x17);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            return;
          }
          ptVar11 = (this->pathStack).c.
                    super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first;
          ptVar14 = ptVar9;
          if (ptVar9 == ptVar11) {
            ptVar14 = (this->pathStack).c.
                      super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          _Var2 = (this->endCell).super__Tuple_impl<0UL,_int,_int>;
          iVar18 = -(uint)((_Head_base<1UL,_int,_false>)
                           _Var2.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                           _M_head_impl ==
                          ptVar14[-1].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                          super__Head_base<1UL,_int,_false>);
          iVar19 = -(uint)(_Var2.super__Head_base<0UL,_int,_false>._M_head_impl._M_head_impl ==
                          ptVar14[-1].super__Tuple_impl<0UL,_int,_int>.
                          super__Head_base<0UL,_int,_false>._M_head_impl);
          auVar17._4_4_ = iVar18;
          auVar17._0_4_ = iVar18;
          auVar17._8_4_ = iVar19;
          auVar17._12_4_ = iVar19;
          iVar18 = movmskpd((int)ptVar14,auVar17);
        } while (iVar18 != 3);
        this->isSolved = true;
        printSolved(this);
      }
      return;
    }
  }
LAB_00102de9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

void Maze::pathBetweenCells() {
    //generates a path between the cells, and shows the path with spaces in the solvedMatrix.
    startCellEndCells();
    int row = std::get<0>(startCell);
    int column = std::get<1>(startCell);
    used.at(row).at(column) = true;
    //MARK START AS SOLVED
    solvedMatrix.at(row).at(column) = ' ';
    pathStack.push(startCell);
    while(!pathStack.empty()){
        auto successorIndex = adjacentCells(std::get<0>(pathStack.top()),std::get<1>(pathStack.top()));
        row = std::get<0>(successorIndex);
        column =std::get<1>(successorIndex);

        int topOfStackRow = std::get<0>(pathStack.top());
        int topOfStackColumn = std::get<1>(pathStack.top());

        if(std::get<0>(successorIndex) == -1){
            //UNMARK CURRENT CELL, as unsolved.
            //BACK TRACK
            solvedMatrix.at(topOfStackRow).at(topOfStackColumn) = '0';
            pathStack.pop();
        }
        else{
            pathStack.push(successorIndex);
            solvedMatrix.at(row).at(column) = ' ';
            used.at(row).at(column) = true;
        }
        if(pathStack.empty()){
            std::cout<<"Error: their is no path"
            <<std::endl;
            break;
        }
        if(pathStack.top() == endCell){
            isSolved = true;
            printSolved();
            break;
        }
    }
}